

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)1>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)1> *div)

{
  __m512i numers_00;
  __m512i sumX4_00;
  short sVar1;
  undefined1 (*pauVar2) [64];
  uint64_t uVar3;
  short *in_RSI;
  random_numerators<short> *in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  __m512i numers;
  const_iterator iter;
  __m512i sumX4;
  size_t count;
  size_t loop;
  type_pun_vec input;
  type_pun_vec result;
  size_t count_1;
  uint16_t q_sign;
  uint16_t is_power_of_2;
  int16_t q;
  int16_t magic;
  int16_t sign;
  uint8_t shift;
  uint8_t more;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  undefined8 in_stack_fffffffffffffb80;
  random_numerators<short> *in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb90 [36];
  uint in_stack_fffffffffffffbb4;
  undefined1 (*pauVar6) [64];
  undefined1 auVar7 [56];
  undefined1 (*local_3c8) [64];
  undefined1 local_3c0 [64];
  size_t local_358;
  short *local_350;
  undefined1 local_340 [64];
  undefined1 (*local_2d0) [64];
  short *local_2c8;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  short *local_208;
  undefined1 local_200 [64];
  short *local_190;
  ulong local_188;
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined8 local_d0;
  short *local_c8;
  undefined1 local_c0 [64];
  ushort local_7c;
  ushort local_7a;
  short local_78;
  short local_76;
  ushort local_74;
  byte local_72;
  byte local_71;
  short *local_70;
  short local_62;
  int local_60;
  int local_5c;
  int local_58;
  short local_54;
  short local_52;
  
  local_358 = 0x20;
  local_340 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar4 = vmovdqa64_avx512f(local_340);
  local_3c0 = vmovdqa64_avx512f(auVar4);
  local_350 = in_RSI;
  local_3c8 = (undefined1 (*) [64])random_numerators<short>::begin(in_RDI);
  while( true ) {
    pauVar6 = local_3c8;
    pauVar2 = (undefined1 (*) [64])random_numerators<short>::end(in_stack_fffffffffffffb88);
    if (pauVar6 == pauVar2) break;
    local_2d0 = local_3c8;
    auVar4 = vmovdqa64_avx512f(*local_3c8);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    local_2c0 = vmovdqa64_avx512f(auVar4);
    local_2c8 = local_350;
    auVar4 = vmovdqa64_avx512f(local_2c0);
    local_208 = local_350;
    local_280 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_280);
    local_190 = local_350;
    local_200 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_200);
    local_c0 = vmovdqa64_avx512f(auVar4);
    local_c8 = local_350;
    local_d0 = 0x20;
    auVar4 = vmovdqa64_avx512f(local_c0);
    local_180 = vmovdqa64_avx512f(auVar4);
    for (local_188 = 0; local_188 < 0x20; local_188 = local_188 + 1) {
      local_62 = *(short *)(local_180 + local_188 * 2);
      local_70 = local_350;
      local_71 = *(byte *)(local_350 + 1);
      local_72 = local_71 & 0x1f;
      local_74 = (ushort)((int)(char)local_71 >> 7);
      local_76 = *local_350;
      local_58 = (int)local_62;
      local_5c = (int)local_76;
      local_60 = local_58 * local_5c;
      sVar1 = (short)((uint)local_60 >> 0x10) + local_62;
      local_7a = (ushort)(local_76 == 0);
      local_7c = sVar1 >> 0xf;
      in_stack_fffffffffffffbb4 = (uint)local_7c;
      local_78 = ((ushort)((int)(short)(sVar1 + (local_7c & (short)(1 << local_72) - local_7a)) >>
                          local_72) ^ local_74) - local_74;
      *(short *)(local_140 + local_188 * 2) = local_78;
      local_54 = local_76;
      local_52 = local_62;
    }
    auVar4 = vmovdqa64_avx512f(local_140);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar7 = auVar4._0_56_;
    auVar5 = vmovdqa64_avx512f(local_3c0);
    vmovdqa64_avx512f(auVar4);
    sumX4_00[1] = auVar7._0_8_;
    sumX4_00[2] = auVar7._8_8_;
    sumX4_00[3] = auVar7._16_8_;
    sumX4_00[4] = auVar7._24_8_;
    sumX4_00[5] = auVar7._32_8_;
    sumX4_00[6] = auVar7._40_8_;
    sumX4_00[7] = auVar7._48_8_;
    sumX4_00[0] = (longlong)pauVar6;
    numers_00[1] = in_stack_fffffffffffffb80;
    numers_00[0] = 0x1078ab;
    numers_00[2] = (longlong)in_stack_fffffffffffffb88;
    numers_00._24_36_ = in_stack_fffffffffffffb90;
    numers_00[7]._4_4_ = in_stack_fffffffffffffbb4;
    add_vector<2ul>(sumX4_00,numers_00);
    local_3c0 = vmovdqa64_avx512f(auVar5);
    local_3c8 = (undefined1 (*) [64])(*local_3c8 + local_358 * 2);
  }
  uVar3 = unsigned_sum_vals<short>((short *)local_3c0,local_358);
  return uVar3;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}